

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_sse4.c
# Opt level: O2

int64_t aom_highbd_sse_sse4_1
                  (uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  short *psVar1;
  short *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  short *psVar8;
  int i;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  short *psVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  int iVar30;
  int iVar32;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar33;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  
  psVar13 = (short *)((long)a8 * 2);
  psVar8 = (short *)((long)b8 * 2);
  if (width == 4) {
    iVar12 = 0;
    auVar20 = (undefined1  [16])0x0;
    do {
      uVar3 = *(undefined8 *)(psVar13 + a_stride);
      uVar4 = *(undefined8 *)psVar13;
      uVar9 = *(ulong *)(psVar8 + b_stride);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar9;
      uVar5 = *(undefined8 *)psVar8;
      auVar35._0_2_ = (short)uVar4 - (short)uVar5;
      auVar35._2_2_ = (short)((ulong)uVar4 >> 0x10) - (short)((ulong)uVar5 >> 0x10);
      auVar35._4_2_ = (short)((ulong)uVar4 >> 0x20) - (short)((ulong)uVar5 >> 0x20);
      auVar35._6_2_ = (short)((ulong)uVar4 >> 0x30) - (short)((ulong)uVar5 >> 0x30);
      auVar35._8_2_ = (short)uVar3 - (short)uVar9;
      auVar35._10_2_ = (short)((ulong)uVar3 >> 0x10) - (short)(uVar9 >> 0x10);
      auVar35._12_2_ = (short)((ulong)uVar3 >> 0x20) - (short)(uVar9 >> 0x20);
      auVar35._14_2_ = (short)((ulong)uVar3 >> 0x30) - (short)(uVar9 >> 0x30);
      auVar35 = pmaddwd(auVar35,auVar35);
      auVar22._0_4_ = auVar20._0_4_ + auVar35._0_4_;
      auVar22._4_4_ = auVar20._4_4_ + auVar35._4_4_;
      auVar22._8_4_ = auVar20._8_4_ + auVar35._8_4_;
      auVar22._12_4_ = auVar20._12_4_ + auVar35._12_4_;
      iVar12 = iVar12 + 2;
      psVar13 = psVar13 + a_stride * 2;
      psVar8 = psVar8 + b_stride * 2;
      auVar20 = auVar22;
    } while (iVar12 < height);
  }
  else {
    if (width != 8) {
      if (width == 0x10) {
        iVar12 = 0;
        lVar15 = 0;
        lVar16 = 0;
        do {
          auVar20 = (undefined1  [16])0x0;
          iVar31 = 1;
          do {
            auVar39._0_2_ = *psVar13 - *psVar8;
            auVar39._2_2_ = psVar13[1] - psVar8[1];
            auVar39._4_2_ = psVar13[2] - psVar8[2];
            auVar39._6_2_ = psVar13[3] - psVar8[3];
            auVar39._8_2_ = psVar13[4] - psVar8[4];
            auVar39._10_2_ = psVar13[5] - psVar8[5];
            auVar39._12_2_ = psVar13[6] - psVar8[6];
            auVar39._14_2_ = psVar13[7] - psVar8[7];
            auVar22 = pmaddwd(auVar39,auVar39);
            auVar41._0_4_ = auVar22._0_4_ + auVar20._0_4_;
            auVar41._4_4_ = auVar22._4_4_ + auVar20._4_4_;
            auVar41._8_4_ = auVar22._8_4_ + auVar20._8_4_;
            auVar41._12_4_ = auVar22._12_4_ + auVar20._12_4_;
            auVar37._0_2_ = psVar13[8] - psVar8[8];
            auVar37._2_2_ = psVar13[9] - psVar8[9];
            auVar37._4_2_ = psVar13[10] - psVar8[10];
            auVar37._6_2_ = psVar13[0xb] - psVar8[0xb];
            auVar37._8_2_ = psVar13[0xc] - psVar8[0xc];
            auVar37._10_2_ = psVar13[0xd] - psVar8[0xd];
            auVar37._12_2_ = psVar13[0xe] - psVar8[0xe];
            auVar37._14_2_ = psVar13[0xf] - psVar8[0xf];
            auVar22 = pmaddwd(auVar37,auVar37);
            auVar20._0_4_ = auVar22._0_4_ + auVar41._0_4_;
            auVar20._4_4_ = auVar22._4_4_ + auVar41._4_4_;
            auVar20._8_4_ = auVar22._8_4_ + auVar41._8_4_;
            auVar20._12_4_ = auVar22._12_4_ + auVar41._12_4_;
            psVar13 = psVar13 + a_stride;
            psVar8 = psVar8 + b_stride;
            if (0x3e < iVar31 - 1U) break;
            bVar7 = iVar31 < height - iVar12;
            iVar31 = iVar31 + 1;
          } while (bVar7);
          auVar22 = pmovzxdq(auVar41,auVar20);
          lVar15 = lVar15 + auVar22._0_8_ + (ulong)auVar20._8_4_;
          lVar16 = lVar16 + auVar22._8_8_ + (ulong)auVar20._12_4_;
          iVar12 = iVar12 + 0x40;
        } while (iVar12 < height);
      }
      else if (width == 0x20) {
        iVar12 = 0;
        lVar15 = 0;
        lVar16 = 0;
        do {
          auVar43 = (undefined1  [16])0x0;
          iVar31 = 1;
          do {
            auVar58._0_2_ = *psVar13 - *psVar8;
            auVar58._2_2_ = psVar13[1] - psVar8[1];
            auVar58._4_2_ = psVar13[2] - psVar8[2];
            auVar58._6_2_ = psVar13[3] - psVar8[3];
            auVar58._8_2_ = psVar13[4] - psVar8[4];
            auVar58._10_2_ = psVar13[5] - psVar8[5];
            auVar58._12_2_ = psVar13[6] - psVar8[6];
            auVar58._14_2_ = psVar13[7] - psVar8[7];
            auVar22 = pmaddwd(auVar58,auVar58);
            auVar62._0_2_ = psVar13[8] - psVar8[8];
            auVar62._2_2_ = psVar13[9] - psVar8[9];
            auVar62._4_2_ = psVar13[10] - psVar8[10];
            auVar62._6_2_ = psVar13[0xb] - psVar8[0xb];
            auVar62._8_2_ = psVar13[0xc] - psVar8[0xc];
            auVar62._10_2_ = psVar13[0xd] - psVar8[0xd];
            auVar62._12_2_ = psVar13[0xe] - psVar8[0xe];
            auVar62._14_2_ = psVar13[0xf] - psVar8[0xf];
            auVar54._0_2_ = psVar13[0x10] - psVar8[0x10];
            auVar54._2_2_ = psVar13[0x11] - psVar8[0x11];
            auVar54._4_2_ = psVar13[0x12] - psVar8[0x12];
            auVar54._6_2_ = psVar13[0x13] - psVar8[0x13];
            auVar54._8_2_ = psVar13[0x14] - psVar8[0x14];
            auVar54._10_2_ = psVar13[0x15] - psVar8[0x15];
            auVar54._12_2_ = psVar13[0x16] - psVar8[0x16];
            auVar54._14_2_ = psVar13[0x17] - psVar8[0x17];
            auVar52._0_2_ = psVar13[0x18] - psVar8[0x18];
            auVar52._2_2_ = psVar13[0x19] - psVar8[0x19];
            auVar52._4_2_ = psVar13[0x1a] - psVar8[0x1a];
            auVar52._6_2_ = psVar13[0x1b] - psVar8[0x1b];
            auVar52._8_2_ = psVar13[0x1c] - psVar8[0x1c];
            auVar52._10_2_ = psVar13[0x1d] - psVar8[0x1d];
            auVar52._12_2_ = psVar13[0x1e] - psVar8[0x1e];
            auVar52._14_2_ = psVar13[0x1f] - psVar8[0x1f];
            auVar24 = pmaddwd(auVar62,auVar62);
            auVar20 = pmaddwd(auVar54,auVar54);
            auVar56._0_4_ = auVar20._0_4_ + auVar24._0_4_ + auVar22._0_4_ + auVar43._0_4_;
            auVar56._4_4_ = auVar20._4_4_ + auVar24._4_4_ + auVar22._4_4_ + auVar43._4_4_;
            auVar56._8_4_ = auVar20._8_4_ + auVar24._8_4_ + auVar22._8_4_ + auVar43._8_4_;
            auVar56._12_4_ = auVar20._12_4_ + auVar24._12_4_ + auVar22._12_4_ + auVar43._12_4_;
            auVar20 = pmaddwd(auVar52,auVar52);
            auVar43._0_4_ = auVar20._0_4_ + auVar56._0_4_;
            auVar43._4_4_ = auVar20._4_4_ + auVar56._4_4_;
            auVar43._8_4_ = auVar20._8_4_ + auVar56._8_4_;
            auVar43._12_4_ = auVar20._12_4_ + auVar56._12_4_;
            psVar13 = psVar13 + a_stride;
            psVar8 = psVar8 + b_stride;
            if (0x1e < iVar31 - 1U) break;
            bVar7 = iVar31 < height - iVar12;
            iVar31 = iVar31 + 1;
          } while (bVar7);
          auVar20 = pmovzxdq(auVar56,auVar43);
          lVar15 = lVar15 + auVar20._0_8_ + (ulong)auVar43._8_4_;
          lVar16 = lVar16 + auVar20._8_8_ + (ulong)auVar43._12_4_;
          iVar12 = iVar12 + 0x20;
        } while (iVar12 < height);
      }
      else if (width == 0x40) {
        iVar12 = 0;
        lVar15 = 0;
        lVar16 = 0;
        do {
          auVar64 = (undefined1  [16])0x0;
          iVar31 = 1;
          do {
            auVar65._0_2_ = *psVar13 - *psVar8;
            auVar65._2_2_ = psVar13[1] - psVar8[1];
            auVar65._4_2_ = psVar13[2] - psVar8[2];
            auVar65._6_2_ = psVar13[3] - psVar8[3];
            auVar65._8_2_ = psVar13[4] - psVar8[4];
            auVar65._10_2_ = psVar13[5] - psVar8[5];
            auVar65._12_2_ = psVar13[6] - psVar8[6];
            auVar65._14_2_ = psVar13[7] - psVar8[7];
            auVar68._0_2_ = psVar13[8] - psVar8[8];
            auVar68._2_2_ = psVar13[9] - psVar8[9];
            auVar68._4_2_ = psVar13[10] - psVar8[10];
            auVar68._6_2_ = psVar13[0xb] - psVar8[0xb];
            auVar68._8_2_ = psVar13[0xc] - psVar8[0xc];
            auVar68._10_2_ = psVar13[0xd] - psVar8[0xd];
            auVar68._12_2_ = psVar13[0xe] - psVar8[0xe];
            auVar68._14_2_ = psVar13[0xf] - psVar8[0xf];
            auVar45._0_2_ = psVar13[0x10] - psVar8[0x10];
            auVar45._2_2_ = psVar13[0x11] - psVar8[0x11];
            auVar45._4_2_ = psVar13[0x12] - psVar8[0x12];
            auVar45._6_2_ = psVar13[0x13] - psVar8[0x13];
            auVar45._8_2_ = psVar13[0x14] - psVar8[0x14];
            auVar45._10_2_ = psVar13[0x15] - psVar8[0x15];
            auVar45._12_2_ = psVar13[0x16] - psVar8[0x16];
            auVar45._14_2_ = psVar13[0x17] - psVar8[0x17];
            auVar59._0_2_ = psVar13[0x18] - psVar8[0x18];
            auVar59._2_2_ = psVar13[0x19] - psVar8[0x19];
            auVar59._4_2_ = psVar13[0x1a] - psVar8[0x1a];
            auVar59._6_2_ = psVar13[0x1b] - psVar8[0x1b];
            auVar59._8_2_ = psVar13[0x1c] - psVar8[0x1c];
            auVar59._10_2_ = psVar13[0x1d] - psVar8[0x1d];
            auVar59._12_2_ = psVar13[0x1e] - psVar8[0x1e];
            auVar59._14_2_ = psVar13[0x1f] - psVar8[0x1f];
            auVar41 = pmaddwd(auVar65,auVar65);
            iVar30 = auVar64._4_4_;
            iVar32 = auVar64._8_4_;
            iVar33 = auVar64._12_4_;
            auVar43 = pmaddwd(auVar68,auVar68);
            auVar24 = pmaddwd(auVar45,auVar45);
            auVar37 = pmaddwd(auVar59,auVar59);
            auVar67._0_2_ = psVar13[0x20] - psVar8[0x20];
            auVar67._2_2_ = psVar13[0x21] - psVar8[0x21];
            auVar67._4_2_ = psVar13[0x22] - psVar8[0x22];
            auVar67._6_2_ = psVar13[0x23] - psVar8[0x23];
            auVar67._8_2_ = psVar13[0x24] - psVar8[0x24];
            auVar67._10_2_ = psVar13[0x25] - psVar8[0x25];
            auVar67._12_2_ = psVar13[0x26] - psVar8[0x26];
            auVar67._14_2_ = psVar13[0x27] - psVar8[0x27];
            auVar20 = pmaddwd(auVar67,auVar67);
            auVar60._0_2_ = psVar13[0x28] - psVar8[0x28];
            auVar60._2_2_ = psVar13[0x29] - psVar8[0x29];
            auVar60._4_2_ = psVar13[0x2a] - psVar8[0x2a];
            auVar60._6_2_ = psVar13[0x2b] - psVar8[0x2b];
            auVar60._8_2_ = psVar13[0x2c] - psVar8[0x2c];
            auVar60._10_2_ = psVar13[0x2d] - psVar8[0x2d];
            auVar60._12_2_ = psVar13[0x2e] - psVar8[0x2e];
            auVar60._14_2_ = psVar13[0x2f] - psVar8[0x2f];
            auVar39 = pmaddwd(auVar60,auVar60);
            auVar46._0_2_ = psVar13[0x30] - psVar8[0x30];
            auVar46._2_2_ = psVar13[0x31] - psVar8[0x31];
            auVar46._4_2_ = psVar13[0x32] - psVar8[0x32];
            auVar46._6_2_ = psVar13[0x33] - psVar8[0x33];
            auVar46._8_2_ = psVar13[0x34] - psVar8[0x34];
            auVar46._10_2_ = psVar13[0x35] - psVar8[0x35];
            auVar46._12_2_ = psVar13[0x36] - psVar8[0x36];
            auVar46._14_2_ = psVar13[0x37] - psVar8[0x37];
            auVar35 = pmaddwd(auVar46,auVar46);
            auVar26._0_2_ = psVar13[0x38] - psVar8[0x38];
            auVar26._2_2_ = psVar13[0x39] - psVar8[0x39];
            auVar26._4_2_ = psVar13[0x3a] - psVar8[0x3a];
            auVar26._6_2_ = psVar13[0x3b] - psVar8[0x3b];
            auVar26._8_2_ = psVar13[0x3c] - psVar8[0x3c];
            auVar26._10_2_ = psVar13[0x3d] - psVar8[0x3d];
            auVar26._12_2_ = psVar13[0x3e] - psVar8[0x3e];
            auVar26._14_2_ = psVar13[0x3f] - psVar8[0x3f];
            auVar22 = pmaddwd(auVar26,auVar26);
            auVar64._0_4_ =
                 auVar22._0_4_ + auVar35._0_4_ +
                 auVar39._0_4_ + auVar20._0_4_ + auVar37._0_4_ +
                 auVar24._0_4_ + auVar43._0_4_ + auVar41._0_4_ + auVar64._0_4_;
            auVar64._4_4_ =
                 auVar22._4_4_ + auVar35._4_4_ +
                 auVar39._4_4_ + auVar20._4_4_ + auVar37._4_4_ +
                 auVar24._4_4_ + auVar43._4_4_ + auVar41._4_4_ + iVar30;
            auVar64._8_4_ =
                 auVar22._8_4_ + auVar35._8_4_ +
                 auVar39._8_4_ + auVar20._8_4_ + auVar37._8_4_ +
                 auVar24._8_4_ + auVar43._8_4_ + auVar41._8_4_ + iVar32;
            auVar64._12_4_ =
                 auVar22._12_4_ + auVar35._12_4_ +
                 auVar39._12_4_ + auVar20._12_4_ + auVar37._12_4_ +
                 auVar24._12_4_ + auVar43._12_4_ + auVar41._12_4_ + iVar33;
            psVar13 = psVar13 + a_stride;
            psVar8 = psVar8 + b_stride;
            if (0xe < iVar31 - 1U) break;
            bVar7 = iVar31 < height - iVar12;
            iVar31 = iVar31 + 1;
          } while (bVar7);
          auVar20 = pmovzxdq(auVar35,auVar64);
          lVar15 = lVar15 + auVar20._0_8_ + (ulong)auVar64._8_4_;
          lVar16 = lVar16 + auVar20._8_8_ + (ulong)auVar64._12_4_;
          iVar12 = iVar12 + 0x10;
        } while (iVar12 < height);
      }
      else if (width == 0x80) {
        iVar12 = 0;
        lVar15 = 0;
        lVar16 = 0;
        do {
          auVar18 = (undefined1  [16])0x0;
          iVar31 = 1;
          do {
            auVar61._0_2_ = *psVar13 - *psVar8;
            auVar61._2_2_ = psVar13[1] - psVar8[1];
            auVar61._4_2_ = psVar13[2] - psVar8[2];
            auVar61._6_2_ = psVar13[3] - psVar8[3];
            auVar61._8_2_ = psVar13[4] - psVar8[4];
            auVar61._10_2_ = psVar13[5] - psVar8[5];
            auVar61._12_2_ = psVar13[6] - psVar8[6];
            auVar61._14_2_ = psVar13[7] - psVar8[7];
            auVar66._0_2_ = psVar13[8] - psVar8[8];
            auVar66._2_2_ = psVar13[9] - psVar8[9];
            auVar66._4_2_ = psVar13[10] - psVar8[10];
            auVar66._6_2_ = psVar13[0xb] - psVar8[0xb];
            auVar66._8_2_ = psVar13[0xc] - psVar8[0xc];
            auVar66._10_2_ = psVar13[0xd] - psVar8[0xd];
            auVar66._12_2_ = psVar13[0xe] - psVar8[0xe];
            auVar66._14_2_ = psVar13[0xf] - psVar8[0xf];
            auVar34._0_2_ = psVar13[0x10] - psVar8[0x10];
            auVar34._2_2_ = psVar13[0x11] - psVar8[0x11];
            auVar34._4_2_ = psVar13[0x12] - psVar8[0x12];
            auVar34._6_2_ = psVar13[0x13] - psVar8[0x13];
            auVar34._8_2_ = psVar13[0x14] - psVar8[0x14];
            auVar34._10_2_ = psVar13[0x15] - psVar8[0x15];
            auVar34._12_2_ = psVar13[0x16] - psVar8[0x16];
            auVar34._14_2_ = psVar13[0x17] - psVar8[0x17];
            auVar51._0_2_ = psVar13[0x18] - psVar8[0x18];
            auVar51._2_2_ = psVar13[0x19] - psVar8[0x19];
            auVar51._4_2_ = psVar13[0x1a] - psVar8[0x1a];
            auVar51._6_2_ = psVar13[0x1b] - psVar8[0x1b];
            auVar51._8_2_ = psVar13[0x1c] - psVar8[0x1c];
            auVar51._10_2_ = psVar13[0x1d] - psVar8[0x1d];
            auVar51._12_2_ = psVar13[0x1e] - psVar8[0x1e];
            auVar51._14_2_ = psVar13[0x1f] - psVar8[0x1f];
            auVar62 = pmaddwd(auVar61,auVar61);
            auVar67 = pmaddwd(auVar66,auVar66);
            auVar35 = pmaddwd(auVar34,auVar34);
            auVar52 = pmaddwd(auVar51,auVar51);
            auVar19._0_2_ = psVar13[0x20] - psVar8[0x20];
            auVar19._2_2_ = psVar13[0x21] - psVar8[0x21];
            auVar19._4_2_ = psVar13[0x22] - psVar8[0x22];
            auVar19._6_2_ = psVar13[0x23] - psVar8[0x23];
            auVar19._8_2_ = psVar13[0x24] - psVar8[0x24];
            auVar19._10_2_ = psVar13[0x25] - psVar8[0x25];
            auVar19._12_2_ = psVar13[0x26] - psVar8[0x26];
            auVar19._14_2_ = psVar13[0x27] - psVar8[0x27];
            auVar20 = pmaddwd(auVar19,auVar19);
            auVar53._0_2_ = psVar13[0x28] - psVar8[0x28];
            auVar53._2_2_ = psVar13[0x29] - psVar8[0x29];
            auVar53._4_2_ = psVar13[0x2a] - psVar8[0x2a];
            auVar53._6_2_ = psVar13[0x2b] - psVar8[0x2b];
            auVar53._8_2_ = psVar13[0x2c] - psVar8[0x2c];
            auVar53._10_2_ = psVar13[0x2d] - psVar8[0x2d];
            auVar53._12_2_ = psVar13[0x2e] - psVar8[0x2e];
            auVar53._14_2_ = psVar13[0x2f] - psVar8[0x2f];
            auVar54 = pmaddwd(auVar53,auVar53);
            auVar21._0_2_ = psVar13[0x30] - psVar8[0x30];
            auVar21._2_2_ = psVar13[0x31] - psVar8[0x31];
            auVar21._4_2_ = psVar13[0x32] - psVar8[0x32];
            auVar21._6_2_ = psVar13[0x33] - psVar8[0x33];
            auVar21._8_2_ = psVar13[0x34] - psVar8[0x34];
            auVar21._10_2_ = psVar13[0x35] - psVar8[0x35];
            auVar21._12_2_ = psVar13[0x36] - psVar8[0x36];
            auVar21._14_2_ = psVar13[0x37] - psVar8[0x37];
            auVar22 = pmaddwd(auVar21,auVar21);
            auVar36._0_2_ = psVar13[0x38] - psVar8[0x38];
            auVar36._2_2_ = psVar13[0x39] - psVar8[0x39];
            auVar36._4_2_ = psVar13[0x3a] - psVar8[0x3a];
            auVar36._6_2_ = psVar13[0x3b] - psVar8[0x3b];
            auVar36._8_2_ = psVar13[0x3c] - psVar8[0x3c];
            auVar36._10_2_ = psVar13[0x3d] - psVar8[0x3d];
            auVar36._12_2_ = psVar13[0x3e] - psVar8[0x3e];
            auVar36._14_2_ = psVar13[0x3f] - psVar8[0x3f];
            auVar37 = pmaddwd(auVar36,auVar36);
            auVar63._0_2_ = psVar13[0x40] - psVar8[0x40];
            auVar63._2_2_ = psVar13[0x41] - psVar8[0x41];
            auVar63._4_2_ = psVar13[0x42] - psVar8[0x42];
            auVar63._6_2_ = psVar13[0x43] - psVar8[0x43];
            auVar63._8_2_ = psVar13[0x44] - psVar8[0x44];
            auVar63._10_2_ = psVar13[0x45] - psVar8[0x45];
            auVar63._12_2_ = psVar13[0x46] - psVar8[0x46];
            auVar63._14_2_ = psVar13[0x47] - psVar8[0x47];
            auVar64 = pmaddwd(auVar63,auVar63);
            auVar23._0_2_ = psVar13[0x48] - psVar8[0x48];
            auVar23._2_2_ = psVar13[0x49] - psVar8[0x49];
            auVar23._4_2_ = psVar13[0x4a] - psVar8[0x4a];
            auVar23._6_2_ = psVar13[0x4b] - psVar8[0x4b];
            auVar23._8_2_ = psVar13[0x4c] - psVar8[0x4c];
            auVar23._10_2_ = psVar13[0x4d] - psVar8[0x4d];
            auVar23._12_2_ = psVar13[0x4e] - psVar8[0x4e];
            auVar23._14_2_ = psVar13[0x4f] - psVar8[0x4f];
            auVar24 = pmaddwd(auVar23,auVar23);
            auVar38._0_2_ = psVar13[0x50] - psVar8[0x50];
            auVar38._2_2_ = psVar13[0x51] - psVar8[0x51];
            auVar38._4_2_ = psVar13[0x52] - psVar8[0x52];
            auVar38._6_2_ = psVar13[0x53] - psVar8[0x53];
            auVar38._8_2_ = psVar13[0x54] - psVar8[0x54];
            auVar38._10_2_ = psVar13[0x55] - psVar8[0x55];
            auVar38._12_2_ = psVar13[0x56] - psVar8[0x56];
            auVar38._14_2_ = psVar13[0x57] - psVar8[0x57];
            auVar39 = pmaddwd(auVar38,auVar38);
            auVar55._0_2_ = psVar13[0x58] - psVar8[0x58];
            auVar55._2_2_ = psVar13[0x59] - psVar8[0x59];
            auVar55._4_2_ = psVar13[0x5a] - psVar8[0x5a];
            auVar55._6_2_ = psVar13[0x5b] - psVar8[0x5b];
            auVar55._8_2_ = psVar13[0x5c] - psVar8[0x5c];
            auVar55._10_2_ = psVar13[0x5d] - psVar8[0x5d];
            auVar55._12_2_ = psVar13[0x5e] - psVar8[0x5e];
            auVar55._14_2_ = psVar13[0x5f] - psVar8[0x5f];
            auVar56 = pmaddwd(auVar55,auVar55);
            auVar40._0_2_ = psVar13[0x60] - psVar8[0x60];
            auVar40._2_2_ = psVar13[0x61] - psVar8[0x61];
            auVar40._4_2_ = psVar13[0x62] - psVar8[0x62];
            auVar40._6_2_ = psVar13[99] - psVar8[99];
            auVar40._8_2_ = psVar13[100] - psVar8[100];
            auVar40._10_2_ = psVar13[0x65] - psVar8[0x65];
            auVar40._12_2_ = psVar13[0x66] - psVar8[0x66];
            auVar40._14_2_ = psVar13[0x67] - psVar8[0x67];
            auVar41 = pmaddwd(auVar40,auVar40);
            auVar57._0_2_ = psVar13[0x68] - psVar8[0x68];
            auVar57._2_2_ = psVar13[0x69] - psVar8[0x69];
            auVar57._4_2_ = psVar13[0x6a] - psVar8[0x6a];
            auVar57._6_2_ = psVar13[0x6b] - psVar8[0x6b];
            auVar57._8_2_ = psVar13[0x6c] - psVar8[0x6c];
            auVar57._10_2_ = psVar13[0x6d] - psVar8[0x6d];
            auVar57._12_2_ = psVar13[0x6e] - psVar8[0x6e];
            auVar57._14_2_ = psVar13[0x6f] - psVar8[0x6f];
            auVar58 = pmaddwd(auVar57,auVar57);
            auVar42._0_2_ = psVar13[0x70] - psVar8[0x70];
            auVar42._2_2_ = psVar13[0x71] - psVar8[0x71];
            auVar42._4_2_ = psVar13[0x72] - psVar8[0x72];
            auVar42._6_2_ = psVar13[0x73] - psVar8[0x73];
            auVar42._8_2_ = psVar13[0x74] - psVar8[0x74];
            auVar42._10_2_ = psVar13[0x75] - psVar8[0x75];
            auVar42._12_2_ = psVar13[0x76] - psVar8[0x76];
            auVar42._14_2_ = psVar13[0x77] - psVar8[0x77];
            auVar43 = pmaddwd(auVar42,auVar42);
            auVar44._0_4_ =
                 auVar43._0_4_ + auVar58._0_4_ + auVar41._0_4_ + auVar56._0_4_ + auVar39._0_4_ +
                 auVar24._0_4_ + auVar64._0_4_ + auVar37._0_4_ + auVar22._0_4_ +
                 auVar54._0_4_ + auVar20._0_4_ + auVar52._0_4_ +
                 auVar35._0_4_ + auVar67._0_4_ + auVar62._0_4_ + auVar18._0_4_;
            auVar44._4_4_ =
                 auVar43._4_4_ + auVar58._4_4_ + auVar41._4_4_ + auVar56._4_4_ + auVar39._4_4_ +
                 auVar24._4_4_ + auVar64._4_4_ + auVar37._4_4_ + auVar22._4_4_ +
                 auVar54._4_4_ + auVar20._4_4_ + auVar52._4_4_ +
                 auVar35._4_4_ + auVar67._4_4_ + auVar62._4_4_ + auVar18._4_4_;
            auVar44._8_4_ =
                 auVar43._8_4_ + auVar58._8_4_ + auVar41._8_4_ + auVar56._8_4_ + auVar39._8_4_ +
                 auVar24._8_4_ + auVar64._8_4_ + auVar37._8_4_ + auVar22._8_4_ +
                 auVar54._8_4_ + auVar20._8_4_ + auVar52._8_4_ +
                 auVar35._8_4_ + auVar67._8_4_ + auVar62._8_4_ + auVar18._8_4_;
            auVar44._12_4_ =
                 auVar43._12_4_ + auVar58._12_4_ + auVar41._12_4_ + auVar56._12_4_ + auVar39._12_4_
                 + auVar24._12_4_ + auVar64._12_4_ + auVar37._12_4_ + auVar22._12_4_ +
                   auVar54._12_4_ + auVar20._12_4_ + auVar52._12_4_ +
                   auVar35._12_4_ + auVar67._12_4_ + auVar62._12_4_ + auVar18._12_4_;
            auVar25._0_2_ = psVar13[0x78] - psVar8[0x78];
            auVar25._2_2_ = psVar13[0x79] - psVar8[0x79];
            auVar25._4_2_ = psVar13[0x7a] - psVar8[0x7a];
            auVar25._6_2_ = psVar13[0x7b] - psVar8[0x7b];
            auVar25._8_2_ = psVar13[0x7c] - psVar8[0x7c];
            auVar25._10_2_ = psVar13[0x7d] - psVar8[0x7d];
            auVar25._12_2_ = psVar13[0x7e] - psVar8[0x7e];
            auVar25._14_2_ = psVar13[0x7f] - psVar8[0x7f];
            auVar20 = pmaddwd(auVar25,auVar25);
            auVar18._0_4_ = auVar20._0_4_ + auVar44._0_4_;
            auVar18._4_4_ = auVar20._4_4_ + auVar44._4_4_;
            auVar18._8_4_ = auVar20._8_4_ + auVar44._8_4_;
            auVar18._12_4_ = auVar20._12_4_ + auVar44._12_4_;
            psVar13 = psVar13 + a_stride;
            psVar8 = psVar8 + b_stride;
            if (6 < iVar31 - 1U) break;
            bVar7 = iVar31 < height - iVar12;
            iVar31 = iVar31 + 1;
          } while (bVar7);
          auVar20 = pmovzxdq(auVar44,auVar18);
          lVar15 = lVar15 + auVar20._0_8_ + (ulong)auVar18._8_4_;
          lVar16 = lVar16 + auVar20._8_8_ + (ulong)auVar18._12_4_;
          iVar12 = iVar12 + 8;
        } while (iVar12 < height);
      }
      else if ((width & 7U) == 0) {
        iVar12 = 0;
        lVar15 = 0;
        lVar16 = 0;
        do {
          auVar29 = (undefined1  [16])0x0;
          uVar14 = 0;
          do {
            lVar11 = 0;
            auVar20 = auVar29;
            do {
              psVar1 = psVar13 + lVar11;
              psVar2 = psVar8 + lVar11;
              auVar50._0_2_ = *psVar1 - *psVar2;
              auVar50._2_2_ = psVar1[1] - psVar2[1];
              auVar50._4_2_ = psVar1[2] - psVar2[2];
              auVar50._6_2_ = psVar1[3] - psVar2[3];
              auVar50._8_2_ = psVar1[4] - psVar2[4];
              auVar50._10_2_ = psVar1[5] - psVar2[5];
              auVar50._12_2_ = psVar1[6] - psVar2[6];
              auVar50._14_2_ = psVar1[7] - psVar2[7];
              auVar22 = pmaddwd(auVar50,auVar50);
              auVar29._0_4_ = auVar20._0_4_ + auVar22._0_4_;
              auVar29._4_4_ = auVar20._4_4_ + auVar22._4_4_;
              auVar29._8_4_ = auVar20._8_4_ + auVar22._8_4_;
              auVar29._12_4_ = auVar20._12_4_ + auVar22._12_4_;
              lVar11 = lVar11 + 8;
              auVar20 = auVar29;
            } while (lVar11 < width);
            psVar13 = psVar13 + a_stride;
            psVar8 = psVar8 + b_stride;
          } while ((uVar14 < 7) && (uVar14 = uVar14 + 1, (int)uVar14 < height - iVar12));
          auVar20 = pmovzxdq(auVar22,auVar29);
          lVar15 = lVar15 + auVar20._0_8_ + (ulong)auVar29._8_4_;
          lVar16 = lVar16 + auVar20._8_8_ + (ulong)auVar29._12_4_;
          iVar12 = iVar12 + 8;
        } while (iVar12 < height);
      }
      else {
        iVar12 = 0;
        lVar15 = 0;
        lVar16 = 0;
        do {
          auVar27 = (undefined1  [16])0x0;
          uVar9 = 0;
          do {
            psVar1 = psVar13 + uVar9;
            psVar2 = psVar8 + uVar9;
            auVar47._0_2_ = *psVar1 - *psVar2;
            auVar47._2_2_ = psVar1[1] - psVar2[1];
            auVar47._4_2_ = psVar1[2] - psVar2[2];
            auVar47._6_2_ = psVar1[3] - psVar2[3];
            auVar47._8_2_ = psVar1[4] - psVar2[4];
            auVar47._10_2_ = psVar1[5] - psVar2[5];
            auVar47._12_2_ = psVar1[6] - psVar2[6];
            auVar47._14_2_ = psVar1[7] - psVar2[7];
            auVar22 = pmaddwd(auVar47,auVar47);
            iVar31 = auVar27._4_4_;
            iVar30 = auVar27._8_4_;
            iVar32 = auVar27._12_4_;
            psVar1 = psVar1 + a_stride;
            psVar2 = psVar2 + b_stride;
            auVar28._0_2_ = *psVar1 - *psVar2;
            auVar28._2_2_ = psVar1[1] - psVar2[1];
            auVar28._4_2_ = psVar1[2] - psVar2[2];
            auVar28._6_2_ = psVar1[3] - psVar2[3];
            auVar28._8_2_ = psVar1[4] - psVar2[4];
            auVar28._10_2_ = psVar1[5] - psVar2[5];
            auVar28._12_2_ = psVar1[6] - psVar2[6];
            auVar28._14_2_ = psVar1[7] - psVar2[7];
            auVar20 = pmaddwd(auVar28,auVar28);
            auVar27._0_4_ = auVar20._0_4_ + auVar22._0_4_ + auVar27._0_4_;
            auVar27._4_4_ = auVar20._4_4_ + auVar22._4_4_ + iVar31;
            auVar27._8_4_ = auVar20._8_4_ + auVar22._8_4_ + iVar30;
            auVar27._12_4_ = auVar20._12_4_ + auVar22._12_4_ + iVar32;
            uVar10 = uVar9 + 8;
            bVar7 = (long)uVar9 < (long)width + -0xc;
            uVar9 = uVar10;
          } while (bVar7);
          uVar10 = uVar10 & 0xffffffff;
          uVar3 = *(undefined8 *)(psVar13 + uVar10);
          uVar4 = *(undefined8 *)(psVar13 + uVar10 + (long)a_stride);
          uVar5 = *(undefined8 *)(psVar8 + uVar10);
          uVar6 = *(undefined8 *)(psVar8 + uVar10 + (long)b_stride);
          auVar48._0_2_ = (short)uVar3 - (short)uVar5;
          auVar48._2_2_ = (short)((ulong)uVar3 >> 0x10) - (short)((ulong)uVar5 >> 0x10);
          auVar48._4_2_ = (short)((ulong)uVar3 >> 0x20) - (short)((ulong)uVar5 >> 0x20);
          auVar48._6_2_ = (short)((ulong)uVar3 >> 0x30) - (short)((ulong)uVar5 >> 0x30);
          auVar48._8_2_ = (short)uVar4 - (short)uVar6;
          auVar48._10_2_ = (short)((ulong)uVar4 >> 0x10) - (short)((ulong)uVar6 >> 0x10);
          auVar48._12_2_ = (short)((ulong)uVar4 >> 0x20) - (short)((ulong)uVar6 >> 0x20);
          auVar48._14_2_ = (short)((ulong)uVar4 >> 0x30) - (short)((ulong)uVar6 >> 0x30);
          auVar20 = pmaddwd(auVar48,auVar48);
          auVar49._0_4_ = auVar20._0_4_ + auVar27._0_4_;
          auVar49._4_4_ = auVar20._4_4_ + auVar27._4_4_;
          auVar49._8_4_ = auVar20._8_4_ + auVar27._8_4_;
          auVar49._12_4_ = auVar20._12_4_ + auVar27._12_4_;
          psVar13 = psVar13 + a_stride * 2;
          psVar8 = psVar8 + b_stride * 2;
          iVar12 = iVar12 + 2;
          auVar20 = pmovzxdq(auVar27,auVar49);
          lVar15 = lVar15 + auVar20._0_8_ + (ulong)auVar49._8_4_;
          lVar16 = lVar16 + auVar20._8_8_ + (ulong)auVar49._12_4_;
        } while (iVar12 < height);
      }
      goto LAB_002ed973;
    }
    iVar12 = 0;
    auVar20 = (undefined1  [16])0x0;
    do {
      auVar17._0_2_ = *psVar13 - *psVar8;
      auVar17._2_2_ = psVar13[1] - psVar8[1];
      auVar17._4_2_ = psVar13[2] - psVar8[2];
      auVar17._6_2_ = psVar13[3] - psVar8[3];
      auVar17._8_2_ = psVar13[4] - psVar8[4];
      auVar17._10_2_ = psVar13[5] - psVar8[5];
      auVar17._12_2_ = psVar13[6] - psVar8[6];
      auVar17._14_2_ = psVar13[7] - psVar8[7];
      auVar24 = pmaddwd(auVar17,auVar17);
      auVar22._0_4_ = auVar20._0_4_ + auVar24._0_4_;
      auVar22._4_4_ = auVar20._4_4_ + auVar24._4_4_;
      auVar22._8_4_ = auVar20._8_4_ + auVar24._8_4_;
      auVar22._12_4_ = auVar20._12_4_ + auVar24._12_4_;
      iVar12 = iVar12 + 1;
      psVar13 = psVar13 + a_stride;
      psVar8 = psVar8 + b_stride;
      auVar20 = auVar22;
    } while (iVar12 < height);
  }
  auVar20 = pmovzxdq(auVar24,auVar22);
  lVar15 = (ulong)auVar22._8_4_ + auVar20._0_8_;
  lVar16 = (ulong)auVar22._12_4_ + auVar20._8_8_;
LAB_002ed973:
  return lVar16 + lVar15;
}

Assistant:

int64_t aom_highbd_sse_sse4_1(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int width,
                              int height) {
  int32_t y = 0;
  int64_t sse = 0;
  uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  __m128i sum = _mm_setzero_si128();
  switch (width) {
    case 4:
      do {
        highbd_sse_w4x2_sse4_1(&sum, a, a_stride, b, b_stride);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 8:
      do {
        highbd_sse_w8_sse4_1(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 16:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8, b + 8);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 64 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 64;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    case 32:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 1, b + 8 * 1);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 2, b + 8 * 2);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 3, b + 8 * 3);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 32 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 32;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    case 64:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 1, b + 8 * 1);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 2, b + 8 * 2);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 3, b + 8 * 3);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 4, b + 8 * 4);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 5, b + 8 * 5);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 6, b + 8 * 6);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 7, b + 8 * 7);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 16 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 16;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    case 128:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 1, b + 8 * 1);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 2, b + 8 * 2);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 3, b + 8 * 3);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 4, b + 8 * 4);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 5, b + 8 * 5);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 6, b + 8 * 6);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 7, b + 8 * 7);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 8, b + 8 * 8);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 9, b + 8 * 9);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 10, b + 8 * 10);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 11, b + 8 * 11);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 12, b + 8 * 12);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 13, b + 8 * 13);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 14, b + 8 * 14);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 15, b + 8 * 15);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 8 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 8;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    default:
      if (width & 0x7) {
        do {
          __m128i sum32 = _mm_setzero_si128();
          int i = 0;
          do {
            highbd_sse_w8_sse4_1(&sum32, a + i, b + i);
            highbd_sse_w8_sse4_1(&sum32, a + i + a_stride, b + i + b_stride);
            i += 8;
          } while (i + 4 < width);
          highbd_sse_w4x2_sse4_1(&sum32, a + i, a_stride, b + i, b_stride);
          a += (a_stride << 1);
          b += (b_stride << 1);
          y += 2;
          summary_32_sse4(&sum32, &sum);
        } while (y < height);
      } else {
        do {
          int l = 0;
          __m128i sum32 = _mm_setzero_si128();
          do {
            int i = 0;
            do {
              highbd_sse_w8_sse4_1(&sum32, a + i, b + i);
              i += 8;
            } while (i < width);
            a += a_stride;
            b += b_stride;
            l += 1;
          } while (l < 8 && l < (height - y));
          summary_32_sse4(&sum32, &sum);
          y += 8;
        } while (y < height);
      }
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
  }
  return sse;
}